

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::ArgumentMismatch::ArgumentMismatch(ArgumentMismatch *this,string *msg)

{
  string local_70;
  allocator local_39;
  string local_38;
  string *local_18;
  string *msg_local;
  ArgumentMismatch *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"ArgumentMismatch",&local_39);
  ::std::__cxx11::string::string((string *)&local_70,(string *)msg);
  ArgumentMismatch(this,&local_38,&local_70,ArgumentMismatch);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, std::size_t received)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(received))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(received)),
                           ExitCodes::ArgumentMismatch) {}